

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O1

void Unr_ManTest(Gia_Man_t *pGia,int nFrames)

{
  int iVar1;
  Gia_Man_t *p;
  Gia_Man_t *p_00;
  long lVar2;
  int iVar3;
  long lVar4;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p = Unr_ManUnroll(pGia,nFrames);
  iVar3 = 3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%s =","Unroll ");
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar4 + lVar2) / 1000000.0);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p_00 = Unr_ManUnrollSimple(pGia,nFrames);
  iVar3 = 3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%s =","UnrollS");
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar4 + lVar2) / 1000000.0);
  Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  Gia_AigerWrite(p,"frames0.aig",0,0,0);
  Gia_AigerWrite(p_00,"frames1.aig",0,0,0);
  Gia_ManStop(p);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Unr_ManTest( Gia_Man_t * pGia, int nFrames )
{
    Gia_Man_t * pFrames0, * pFrames1;
    abctime clk = Abc_Clock();
    pFrames0 = Unr_ManUnroll( pGia, nFrames );
    Abc_PrintTime( 1, "Unroll ", Abc_Clock() - clk );
    clk = Abc_Clock();
    pFrames1 = Unr_ManUnrollSimple( pGia, nFrames );
    Abc_PrintTime( 1, "UnrollS", Abc_Clock() - clk );

Gia_ManPrintStats( pFrames0, NULL );
Gia_ManPrintStats( pFrames1, NULL );
Gia_AigerWrite( pFrames0, "frames0.aig", 0, 0, 0 );
Gia_AigerWrite( pFrames1, "frames1.aig", 0, 0, 0 );

    Gia_ManStop( pFrames0 );
    Gia_ManStop( pFrames1 );
}